

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O0

void __thiscall
ft::deque<int,_ft::allocator<int>_>::dequeInit(deque<int,_ft::allocator<int>_> *this,size_type n)

{
  ulong uVar1;
  size_type sVar2;
  unsigned_long *puVar3;
  pointer ppiVar4;
  int *local_60;
  pointer p;
  size_type i;
  map_pointer tmp_finish;
  map_pointer tmp_start;
  unsigned_long local_38 [3];
  allocator<int_*> local_19;
  size_type sStack_18;
  chunk_allocator chunk_alloc;
  size_type n_local;
  deque<int,_ft::allocator<int>_> *this_local;
  
  sStack_18 = n;
  allocator<int_*>::allocator(&local_19);
  uVar1 = sStack_18;
  sVar2 = chunk_size(this);
  this->m_chunks = uVar1 / sVar2 + 1;
  local_38[0] = 8;
  tmp_start = (map_pointer)(this->m_chunks + 2);
  puVar3 = max<unsigned_long>(local_38,(unsigned_long *)&tmp_start);
  this->m_map_size = *puVar3;
  ppiVar4 = allocator<int_*>::allocate(&local_19,this->m_map_size);
  this->m_map = ppiVar4;
  tmp_finish = this->m_map + (this->m_map_size - this->m_chunks >> 1);
  i = (size_type)(tmp_finish + (this->m_chunks - 1));
  for (p = (pointer)0x0; p < (pointer)this->m_map_size; p = (pointer)((long)p + 1)) {
    local_60 = (pointer)0x0;
    if ((tmp_finish <= this->m_map + (long)p) && (this->m_map + (long)p <= i)) {
      sVar2 = chunk_size(this);
      local_60 = allocator<int>::allocate((allocator<int> *)&this->field_0x70,sVar2);
    }
    allocator<int_*>::construct(&local_19,this->m_map + (long)p,&local_60);
  }
  dequeIterator<int,_64UL>::setNode
            (&this->m_start,
             (map_pointer)((long)this->m_map + (this->m_map_size * 4 - 4 & 0xfffffffffffffff8)));
  (this->m_start).m_cur = (this->m_start).m_first;
  dequeIterator<int,_64UL>::setNode
            (&this->m_finish,
             (map_pointer)((long)this->m_map + (this->m_map_size * 4 - 4 & 0xfffffffffffffff8)));
  (this->m_finish).m_cur = (this->m_finish).m_first;
  allocator<int_*>::~allocator(&local_19);
  return;
}

Assistant:

void dequeInit(size_type n) {
		chunk_allocator	chunk_alloc;

		this->m_chunks = (n / this->chunk_size()) + 1;
		this->m_map_size = ft::max<size_type>(8, this->m_chunks + 2);
		this->m_map = chunk_alloc.allocate(this->m_map_size);

		map_pointer	tmp_start = this->m_map + ((this->m_map_size - this->m_chunks) / 2);
		map_pointer	tmp_finish = tmp_start + this->m_chunks - 1;

		for (size_type i = 0; i < this->m_map_size; ++i) {
			pointer p = NULL;
			if (this->m_map + i >= tmp_start && this->m_map + i <= tmp_finish)
				p = this->m_alloc.allocate(this->chunk_size());
			chunk_alloc.construct(this->m_map + i, p);
		}

		this->m_start.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_start.m_cur = this->m_start.m_first;
		this->m_finish.setNode(this->m_map + ((this->m_map_size - 1) / 2));
		this->m_finish.m_cur = this->m_finish.m_first;
	}